

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_NtkWriteModelIntStruct(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover,char *pStr)

{
  word *pwVar1;
  uint nInputs;
  word *pwVar2;
  undefined4 uVar3;
  word wVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined8 uVar11;
  int iVar12;
  int nLutLeaf;
  uint uVar13;
  int iVar14;
  int iVar15;
  int nLutRoot;
  long lVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  word Func1;
  word Func0;
  char pLut2 [32];
  word Func2;
  char pLut1 [32];
  char pLut0 [32];
  word pRes [1024];
  word pCube [1024];
  
  nInputs = (pNode->vFanins).nSize;
  fputc(10,(FILE *)pFile);
  fprintf((FILE *)pFile,".model m%d\n",(ulong)(uint)pNode->Id);
  fwrite(".inputs",7,1,(FILE *)pFile);
  if (0 < (pNode->vFanins).nSize) {
    iVar14 = 0;
    do {
      fprintf((FILE *)pFile," %c",(ulong)(iVar14 + 0x61));
      iVar14 = iVar14 + 1;
    } while (iVar14 < (pNode->vFanins).nSize);
  }
  fputc(10,(FILE *)pFile);
  fwrite(".outputs o\n",0xb,1,(FILE *)pFile);
  sVar5 = strlen(pStr);
  iVar14 = (int)sVar5;
  if (iVar14 - 4U < 0xfffffffe) {
    printf("Wrong LUT struct (%s)\n",pStr);
    return;
  }
  uVar8 = 0;
  do {
    if ((byte)(pStr[uVar8] - 0x37U) < 0xfc) {
      printf("The LUT size (%d) should belong to {3,4,5,6}.\n",(ulong)((int)pStr[uVar8] - 0x30));
      return;
    }
    uVar8 = uVar8 + 1;
  } while ((sVar5 & 0xffffffff) != uVar8);
  iVar15 = 0;
  if (iVar14 == 3) {
    iVar15 = pStr[1] + -0x30;
  }
  iVar12 = iVar15 + -1;
  if (iVar15 == 0) {
    iVar12 = 0;
  }
  if ((int)pStr[iVar14 - 1] + iVar12 + *pStr + -0x61 < (int)nInputs) {
    printf("The node size (%d) is too large for the LUT structure %s.\n",(ulong)nInputs,pStr);
    return;
  }
  nLutLeaf = *pStr + -0x30;
  nLutRoot = pStr[iVar14 - 1] + -0x30;
  iVar12 = nLutRoot;
  if (nLutRoot < nLutLeaf) {
    iVar12 = nLutLeaf;
  }
  if (iVar12 < iVar15) {
    iVar12 = iVar15;
  }
  if ((int)nInputs <= iVar12) {
    fwrite(".names",6,1,(FILE *)pFile);
    if (0 < (pNode->vFanins).nSize) {
      iVar14 = 0;
      do {
        fprintf((FILE *)pFile," %c",(ulong)(iVar14 + 0x61));
        iVar14 = iVar14 + 1;
      } while (iVar14 < (pNode->vFanins).nSize);
    }
    fprintf((FILE *)pFile," %s\n","o");
    fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
    fwrite(".end\n",5,1,(FILE *)pFile);
    return;
  }
  pLut2[0x10] = '\0';
  pLut2[0x11] = '\0';
  pLut2[0x12] = '\0';
  pLut2[0x13] = '\0';
  pLut2[0x14] = '\0';
  pLut2[0x15] = '\0';
  pLut2[0x16] = '\0';
  pLut2[0x17] = '\0';
  pLut2[0x18] = '\0';
  pLut2[0x19] = '\0';
  pLut2[0x1a] = '\0';
  pLut2[0x1b] = '\0';
  pLut2[0x1c] = '\0';
  pLut2[0x1d] = '\0';
  pLut2[0x1e] = '\0';
  pLut2[0x1f] = '\0';
  pLut2[0] = '\0';
  pLut2[1] = '\0';
  pLut2[2] = '\0';
  pLut2[3] = '\0';
  pLut2[4] = '\0';
  pLut2[5] = '\0';
  pLut2[6] = '\0';
  pLut2[7] = '\0';
  pLut2[8] = '\0';
  pLut2[9] = '\0';
  pLut2[10] = '\0';
  pLut2[0xb] = '\0';
  pLut2[0xc] = '\0';
  pLut2[0xd] = '\0';
  pLut2[0xe] = '\0';
  pLut2[0xf] = '\0';
  if (Io_NtkWriteModelIntStruct::TruthStore[0][0] == 0) {
    lVar16 = 0;
    lVar17 = 1;
    lVar9 = 0;
    do {
      *(word (**) [1024])((long)Io_NtkWriteModelIntStruct::pTruths + lVar9) =
           Io_NtkWriteModelIntStruct::TruthStore + lVar16;
      *(word (**) [1024])((long)Io_NtkWriteModelIntStruct::pTruths + lVar9 + 8) =
           Io_NtkWriteModelIntStruct::TruthStore + lVar17;
      lVar16 = lVar16 + 2;
      lVar17 = lVar17 + 2;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 0x80);
    lVar9 = 0;
    do {
      pwVar2 = Io_NtkWriteModelIntStruct::pTruths[lVar9];
      wVar4 = Io_NtkWriteNodeIntStruct::Truth6[lVar9];
      uVar3 = *(undefined4 *)((long)Io_NtkWriteNodeIntStruct::Truth6 + lVar9 * 8 + 4);
      lVar16 = 0;
      do {
        pwVar1 = pwVar2 + lVar16;
        *(int *)pwVar1 = (int)wVar4;
        *(undefined4 *)((long)pwVar1 + 4) = uVar3;
        *(int *)(pwVar1 + 1) = (int)wVar4;
        *(undefined4 *)((long)pwVar1 + 0xc) = uVar3;
        lVar16 = lVar16 + 2;
      } while (lVar16 != 0x400);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 6);
    lVar9 = 6;
    do {
      pwVar2 = Io_NtkWriteModelIntStruct::pTruths[lVar9];
      uVar13 = 1 << ((char)lVar9 - 6U & 0x1f);
      lVar16 = 0;
      uVar18 = 0;
      uVar19 = 1;
      do {
        uVar20 = uVar13 & uVar18;
        uVar21 = uVar13 & uVar19;
        pwVar1 = pwVar2 + lVar16;
        *(uint *)pwVar1 = -(uint)(uVar20 == 0) ^ 0xffffffff;
        *(uint *)((long)pwVar1 + 4) = -(uint)(uVar20 == 0) ^ 0xffffffff;
        *(uint *)(pwVar1 + 1) = -(uint)(uVar21 == 0) ^ 0xffffffff;
        *(uint *)((long)pwVar1 + 0xc) = -(uint)(uVar21 == 0) ^ 0xffffffff;
        lVar16 = lVar16 + 2;
        uVar18 = uVar18 + 2;
        uVar19 = uVar19 + 2;
      } while (lVar16 != 0x400);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x10);
  }
  Abc_SopToTruthBig((char *)(pNode->field_5).pData,nInputs,Io_NtkWriteModelIntStruct::pTruths,pCube,
                    pRes);
  uVar8 = (ulong)(uint)(1 << ((char)nInputs - 5U & 0x1f));
  uVar6 = uVar8;
  if ((int)nInputs < 6) {
    uVar8 = 1;
    uVar6 = uVar8;
  }
  do {
    if ((int)uVar8 < 1) goto LAB_0033e110;
    lVar9 = uVar8 * 4;
    uVar8 = uVar8 - 1;
    uVar10 = uVar6;
  } while (*(int *)((long)pRes + lVar9 + -4) == 0);
  do {
    if ((int)uVar10 < 1) goto LAB_0033e110;
    lVar9 = uVar10 * 4;
    uVar10 = uVar10 - 1;
  } while (*(int *)((long)pRes + lVar9 + -4) == -1);
  if (iVar14 == 2) {
    iVar15 = If_CluCheckExt((void *)0x0,pRes,nInputs,nLutLeaf,nLutRoot,pLut0,pLut1,&Func0,&Func1);
    if (iVar15 == 0) {
      Extra_PrintHex(_stdout,(uint *)pRes,nInputs);
      printf("    ");
LAB_0033e4c4:
      Kit_DsdPrintFromTruth((uint *)pRes,nInputs);
      putchar(10);
      pcVar7 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar7);
      return;
    }
  }
  else {
    iVar15 = If_CluCheckExt3((void *)0x0,pRes,nInputs,nLutLeaf,iVar15,nLutRoot,pLut0,pLut1,pLut2,
                             &Func0,&Func1,&Func2);
    if (iVar15 == 0) {
      Extra_PrintHex(_stdout,(uint *)pRes,nInputs);
      printf("    ");
      goto LAB_0033e4c4;
    }
  }
  fwrite(".names",6,1,(FILE *)pFile);
  if ('\0' < pLut1[0]) {
    lVar9 = 0;
    do {
      fprintf((FILE *)pFile," %c",(ulong)((int)pLut1[lVar9 + 2] + 0x61));
      lVar9 = lVar9 + 1;
    } while (lVar9 < pLut1[0]);
  }
  fwrite(" lut1\n",6,1,(FILE *)pFile);
  pcVar7 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func1,(int)pLut1[0],vCover);
  fputs(pcVar7,(FILE *)pFile);
  if ((iVar14 == 3) && ('\0' < pLut2[0])) {
    fwrite(".names",6,1,(FILE *)pFile);
    if ('\0' < pLut2[0]) {
      lVar9 = 0;
      do {
        if (nInputs == (int)pLut2[lVar9 + 2]) {
          fwrite(" lut1",5,1,(FILE *)pFile);
        }
        else {
          fprintf((FILE *)pFile," %c",(ulong)((int)pLut2[lVar9 + 2] + 0x61));
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pLut2[0]);
    }
    fwrite(" lut2\n",6,1,(FILE *)pFile);
    pcVar7 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func2,(int)pLut2[0],vCover);
    fputs(pcVar7,(FILE *)pFile);
  }
  fwrite(".names",6,1,(FILE *)pFile);
  if ('\0' < pLut0[0]) {
    lVar9 = 0;
    do {
      uVar18 = (uint)pLut0[lVar9 + 2];
      if (nInputs == uVar18) {
        pcVar7 = " lut1";
LAB_0033e41c:
        fwrite(pcVar7,5,1,(FILE *)pFile);
      }
      else {
        if (nInputs + 1 == uVar18) {
          pcVar7 = " lut2";
          goto LAB_0033e41c;
        }
        fprintf((FILE *)pFile," %c",(ulong)(uVar18 + 0x61));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pLut0[0]);
  }
  fprintf((FILE *)pFile," %s\n","o");
  pcVar7 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Func0,(int)pLut0[0],vCover);
  fputs(pcVar7,(FILE *)pFile);
  goto LAB_0033e1cb;
  while (lVar9 = uVar6 * 4, uVar6 = uVar6 - 1, *(int *)((long)pRes + lVar9 + -4) == -1) {
LAB_0033e110:
    if ((int)uVar6 < 1) {
      uVar11 = 1;
      goto LAB_0033e1b3;
    }
  }
  uVar11 = 0;
LAB_0033e1b3:
  fprintf((FILE *)pFile,".names %s\n %d\n","o",uVar11);
LAB_0033e1cb:
  fwrite(".end\n",5,1,(FILE *)pFile);
  return;
}

Assistant:

void Io_NtkWriteModelIntStruct( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover, char * pStr )
{
    Abc_Obj_t * pNet;
    int nLeaves = Abc_ObjFaninNum(pNode);
    int i, nLutLeaf, nLutLeaf2, nLutRoot, Length;

    // write the header
    fprintf( pFile, "\n" );
    fprintf( pFile, ".model m%d\n", Abc_ObjId(pNode) );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
        fprintf( pFile, " %c", 'a' + i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs o\n" );

    // quit if parameters are wrong
    Length = strlen(pStr);
    if ( Length != 2 && Length != 3 )
    {
        printf( "Wrong LUT struct (%s)\n", pStr );
        return;
    }
    for ( i = 0; i < Length; i++ )
        if ( pStr[i] - '0' < 3 || pStr[i] - '0' > 6 )
        {
            printf( "The LUT size (%d) should belong to {3,4,5,6}.\n", pStr[i] - '0' );
            return;
        }

    nLutLeaf  =                   pStr[0] - '0';
    nLutLeaf2 = ( Length == 3 ) ? pStr[1] - '0' : 0;
    nLutRoot  =                   pStr[Length-1] - '0';
    if ( nLeaves > nLutLeaf - 1 + (nLutLeaf2 ? nLutLeaf2 - 1 : 0) + nLutRoot )
    {
        printf( "The node size (%d) is too large for the LUT structure %s.\n", nLeaves, pStr );
        return;
    }

    // consider easy case
    if ( nLeaves <= Abc_MaxInt( nLutLeaf2, Abc_MaxInt(nLutLeaf, nLutRoot) ) )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %c", 'a' + i );
        // get the output name
        fprintf( pFile, " %s\n", "o" );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
        fprintf( pFile, ".end\n" );
        return;
    }
    else
    {
        extern int If_CluMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars );

        static word TruthStore[16][1<<10] = {{0}}, * pTruths[16];
        word pCube[1<<10], pRes[1<<10], Func0, Func1, Func2;
        char pLut0[32], pLut1[32], pLut2[32] = {0}, * pSop;
//        int nVarsMin[3], pVars[3][20];

        if ( TruthStore[0][0] == 0 )
        {
            static word Truth6[6] = {
                ABC_CONST(0xAAAAAAAAAAAAAAAA),
                ABC_CONST(0xCCCCCCCCCCCCCCCC),
                ABC_CONST(0xF0F0F0F0F0F0F0F0),
                ABC_CONST(0xFF00FF00FF00FF00),
                ABC_CONST(0xFFFF0000FFFF0000),
                ABC_CONST(0xFFFFFFFF00000000)
            };
            int nVarsMax = 16;
            int nWordsMax = (1 << 10);
            int i, k;
            assert( nVarsMax <= 16 );
            for ( i = 0; i < nVarsMax; i++ )
                pTruths[i] = TruthStore[i];
            for ( i = 0; i < 6; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = Truth6[i];
            for ( i = 6; i < nVarsMax; i++ )
                for ( k = 0; k < nWordsMax; k++ )
                    pTruths[i][k] = ((k >> (i-6)) & 1) ? ~(word)0 : 0;
        }

        // collect variables
//        Abc_ObjForEachFanin( pNode, pNet, i )
//            pVars[0][i] = pVars[1][i] = pVars[2][i] = i;

        // derive truth table
        Abc_SopToTruthBig( (char*)Abc_ObjData(pNode), nLeaves, pTruths, pCube, pRes );
        if ( Kit_TruthIsConst0((unsigned *)pRes, nLeaves) || Kit_TruthIsConst1((unsigned *)pRes, nLeaves) )
        {
            fprintf( pFile, ".names %s\n %d\n", "o", Kit_TruthIsConst1((unsigned *)pRes, nLeaves) );
            fprintf( pFile, ".end\n" );
            return;
        }

//        Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
//        Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );

        // perform decomposition
        if ( Length == 2 )
        {
            if ( !If_CluCheckExt( NULL, pRes, nLeaves, nLutLeaf, nLutRoot, pLut0, pLut1, &Func0, &Func1 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }
        else
        {
            if ( !If_CluCheckExt3( NULL, pRes, nLeaves, nLutLeaf, nLutLeaf2, nLutRoot, pLut0, pLut1, pLut2, &Func0, &Func1, &Func2 ) )
            {
                Extra_PrintHex( stdout, (unsigned *)pRes, nLeaves );  printf( "    " );
                Kit_DsdPrintFromTruth( (unsigned*)pRes, nLeaves );  printf( "\n" );
                printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                return;
            }
        }

        // write leaf node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut1[0]; i++ )
            fprintf( pFile, " %c", 'a' + pLut1[2+i] );
        fprintf( pFile, " lut1\n" );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func1, pLut1[0], vCover );
        fprintf( pFile, "%s", pSop );

        if ( Length == 3 && pLut2[0] > 0 )
        {
            // write leaf node
            fprintf( pFile, ".names" );
            for ( i = 0; i < pLut2[0]; i++ )
                if ( pLut2[2+i] == nLeaves )
                    fprintf( pFile, " lut1" );
                else
                    fprintf( pFile, " %c", 'a' + pLut2[2+i] );
            fprintf( pFile, " lut2\n" );
            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func2, pLut2[0], vCover );
            fprintf( pFile, "%s", pSop );
        }

        // write root node
        fprintf( pFile, ".names" );
        for ( i = 0; i < pLut0[0]; i++ )
            if ( pLut0[2+i] == nLeaves )
                fprintf( pFile, " lut1" );
            else if ( pLut0[2+i] == nLeaves+1 )
                fprintf( pFile, " lut2" );
            else
                fprintf( pFile, " %c", 'a' + pLut0[2+i] );
        fprintf( pFile, " %s\n", "o" );
        // write SOP
        pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, Func0, pLut0[0], vCover );
        fprintf( pFile, "%s", pSop );
        fprintf( pFile, ".end\n" );
    }
}